

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O3

void eastl::RBTreeErase(rbtree_node_base *pNode,rbtree_node_base *pNodeAnchor)

{
  this_type **pptVar1;
  char cVar2;
  this_type *ptVar3;
  rbtree_node_base *prVar4;
  this_type *ptVar5;
  this_type *ptVar6;
  this_type *ptVar7;
  this_type *ptVar8;
  this_type *ptVar9;
  rbtree_node_base *pNodeTemp_1;
  this_type *ptVar10;
  bool bVar11;
  
  pptVar1 = &pNodeAnchor->mpNodeParent;
  ptVar5 = pNode->mpNodeRight;
  ptVar6 = pNode->mpNodeLeft;
  prVar4 = pNode;
  ptVar3 = ptVar5;
  if (ptVar6 == (this_type *)0x0) {
LAB_0010518d:
    ptVar8 = prVar4->mpNodeParent;
    if (ptVar3 != (this_type *)0x0) goto LAB_00105199;
    ptVar3 = (this_type *)0x0;
  }
  else {
    if (ptVar5 != (this_type *)0x0) {
      do {
        prVar4 = ptVar3;
        ptVar3 = prVar4->mpNodeLeft;
      } while (prVar4->mpNodeLeft != (this_type *)0x0);
      ptVar3 = prVar4->mpNodeRight;
      if (prVar4 != pNode) {
        ptVar6->mpNodeParent = prVar4;
        prVar4->mpNodeLeft = ptVar6;
        ptVar8 = prVar4;
        if (prVar4 != ptVar5) {
          ptVar8 = prVar4->mpNodeParent;
          if (ptVar3 != (this_type *)0x0) {
            ptVar3->mpNodeParent = ptVar8;
          }
          ptVar8->mpNodeLeft = ptVar3;
          prVar4->mpNodeRight = ptVar5;
          pNode->mpNodeRight->mpNodeParent = prVar4;
        }
        if (*pptVar1 == pNode) {
          *pptVar1 = prVar4;
          ptVar5 = pNode->mpNodeParent;
        }
        else {
          ptVar5 = pNode->mpNodeParent;
          if (ptVar5->mpNodeLeft == pNode) {
            ptVar5->mpNodeLeft = prVar4;
          }
          else {
            ptVar5->mpNodeRight = prVar4;
          }
        }
        prVar4->mpNodeParent = ptVar5;
        cVar2 = prVar4->mColor;
        prVar4->mColor = pNode->mColor;
        pNode->mColor = cVar2;
        goto LAB_0010522a;
      }
      goto LAB_0010518d;
    }
    ptVar8 = pNode->mpNodeParent;
    ptVar3 = ptVar6;
LAB_00105199:
    ptVar3->mpNodeParent = ptVar8;
  }
  ptVar5 = (this_type *)pptVar1;
  if (*pptVar1 != pNode) {
    ptVar6 = pNode->mpNodeParent;
    ptVar5 = (this_type *)&ptVar6->mpNodeLeft;
    if (ptVar6->mpNodeLeft != pNode) {
      ptVar5 = ptVar6;
    }
  }
  ptVar5->mpNodeRight = ptVar3;
  if (pNodeAnchor->mpNodeLeft == pNode) {
    ptVar5 = ptVar3;
    if (pNode->mpNodeRight == (this_type *)0x0) {
      ptVar6 = pNode->mpNodeParent;
    }
    else {
      do {
        ptVar6 = ptVar5;
        ptVar5 = ptVar6->mpNodeLeft;
      } while (ptVar6->mpNodeLeft != (this_type *)0x0);
    }
    pNodeAnchor->mpNodeLeft = ptVar6;
  }
  if (pNodeAnchor->mpNodeRight == pNode) {
    ptVar5 = ptVar3;
    if (pNode->mpNodeLeft == (this_type *)0x0) {
      ptVar6 = pNode->mpNodeParent;
    }
    else {
      do {
        ptVar6 = ptVar5;
        ptVar5 = ptVar6->mpNodeRight;
      } while (ptVar6->mpNodeRight != (this_type *)0x0);
    }
    pNodeAnchor->mpNodeRight = ptVar6;
  }
LAB_0010522a:
  if (pNode->mColor == '\x01') {
    ptVar5 = *pptVar1;
    if (ptVar3 == ptVar5) {
LAB_001054ff:
      if (ptVar3 == (this_type *)0x0) {
        return;
      }
    }
    else {
      do {
        if ((ptVar3 != (this_type *)0x0) && (ptVar3->mColor != '\x01')) break;
        ptVar6 = ptVar8->mpNodeLeft;
        if (ptVar3 == ptVar6) {
          ptVar6 = ptVar8->mpNodeRight;
          if (ptVar6->mColor == '\0') {
            ptVar6->mColor = '\x01';
            ptVar8->mColor = '\0';
            ptVar7 = ptVar6->mpNodeLeft;
            ptVar8->mpNodeRight = ptVar7;
            if (ptVar7 != (this_type *)0x0) {
              ptVar7->mpNodeParent = ptVar8;
            }
            ptVar7 = ptVar8->mpNodeParent;
            ptVar6->mpNodeParent = ptVar7;
            ptVar10 = ptVar6;
            if (ptVar8 != ptVar5) {
              (&ptVar7->mpNodeRight)[ptVar7->mpNodeLeft == ptVar8] = ptVar6;
              ptVar10 = ptVar5;
            }
            ptVar5 = ptVar10;
            ptVar6->mpNodeLeft = ptVar8;
            ptVar8->mpNodeParent = ptVar6;
            *pptVar1 = ptVar5;
            ptVar6 = ptVar8->mpNodeRight;
          }
          ptVar7 = ptVar6->mpNodeLeft;
          if ((ptVar7 == (this_type *)0x0) || (ptVar7->mColor == '\x01')) {
            ptVar10 = ptVar6->mpNodeRight;
            if ((ptVar10 == (this_type *)0x0) || (ptVar10->mColor == '\x01')) goto LAB_0010535d;
LAB_00105448:
            if (ptVar10->mColor == '\x01') goto LAB_0010544f;
            ptVar6->mColor = ptVar8->mColor;
            ptVar8->mColor = '\x01';
LAB_001054bb:
            ptVar10->mColor = '\x01';
            ptVar9 = ptVar5;
          }
          else {
            ptVar10 = ptVar6->mpNodeRight;
            if (ptVar10 != (this_type *)0x0) goto LAB_00105448;
LAB_0010544f:
            ptVar7->mColor = '\x01';
            ptVar6->mColor = '\0';
            ptVar10 = ptVar7->mpNodeRight;
            ptVar6->mpNodeLeft = ptVar10;
            if (ptVar10 != (this_type *)0x0) {
              ptVar10->mpNodeParent = ptVar6;
            }
            ptVar10 = ptVar6->mpNodeParent;
            ptVar7->mpNodeParent = ptVar10;
            ptVar9 = ptVar7;
            if (ptVar6 != ptVar5) {
              (&ptVar10->mpNodeRight)[ptVar10->mpNodeRight != ptVar6] = ptVar7;
              ptVar9 = ptVar5;
            }
            ptVar7->mpNodeRight = ptVar6;
            ptVar6->mpNodeParent = ptVar7;
            *pptVar1 = ptVar9;
            ptVar6 = ptVar8->mpNodeRight;
            ptVar10 = ptVar6->mpNodeRight;
            ptVar6->mColor = ptVar8->mColor;
            ptVar8->mColor = '\x01';
            ptVar5 = ptVar9;
            if (ptVar10 != (this_type *)0x0) goto LAB_001054bb;
          }
          ptVar5 = ptVar6->mpNodeLeft;
          ptVar8->mpNodeRight = ptVar5;
          if (ptVar5 != (this_type *)0x0) {
            ptVar5->mpNodeParent = ptVar8;
          }
          ptVar5 = ptVar8->mpNodeParent;
          ptVar6->mpNodeParent = ptVar5;
          ptVar7 = ptVar6;
          if (ptVar8 != ptVar9) {
            (&ptVar5->mpNodeRight)[ptVar5->mpNodeLeft == ptVar8] = ptVar6;
            ptVar7 = ptVar9;
          }
          ptVar6->mpNodeLeft = ptVar8;
LAB_001054f5:
          ptVar8->mpNodeParent = ptVar6;
          *pptVar1 = ptVar7;
          goto LAB_001054ff;
        }
        if (ptVar6->mColor == '\0') {
          ptVar6->mColor = '\x01';
          ptVar8->mColor = '\0';
          ptVar7 = ptVar6->mpNodeRight;
          ptVar8->mpNodeLeft = ptVar7;
          if (ptVar7 != (this_type *)0x0) {
            ptVar7->mpNodeParent = ptVar8;
          }
          ptVar7 = ptVar8->mpNodeParent;
          ptVar6->mpNodeParent = ptVar7;
          ptVar10 = ptVar6;
          if (ptVar8 != ptVar5) {
            (&ptVar7->mpNodeRight)[ptVar7->mpNodeRight != ptVar8] = ptVar6;
            ptVar10 = ptVar5;
          }
          ptVar5 = ptVar10;
          ptVar6->mpNodeRight = ptVar8;
          ptVar8->mpNodeParent = ptVar6;
          *pptVar1 = ptVar5;
          ptVar6 = ptVar8->mpNodeLeft;
        }
        ptVar7 = ptVar6->mpNodeRight;
        if ((ptVar7 != (this_type *)0x0) && (ptVar7->mColor != '\x01')) {
          ptVar10 = ptVar6->mpNodeLeft;
          if (ptVar10 != (this_type *)0x0) goto LAB_0010538c;
LAB_00105393:
          ptVar7->mColor = '\x01';
          ptVar6->mColor = '\0';
          ptVar10 = ptVar7->mpNodeLeft;
          ptVar6->mpNodeRight = ptVar10;
          if (ptVar10 != (this_type *)0x0) {
            ptVar10->mpNodeParent = ptVar6;
          }
          ptVar10 = ptVar6->mpNodeParent;
          ptVar7->mpNodeParent = ptVar10;
          ptVar9 = ptVar7;
          if (ptVar6 != ptVar5) {
            (&ptVar10->mpNodeRight)[ptVar10->mpNodeLeft == ptVar6] = ptVar7;
            ptVar9 = ptVar5;
          }
          ptVar7->mpNodeLeft = ptVar6;
          ptVar6->mpNodeParent = ptVar7;
          *pptVar1 = ptVar9;
          ptVar6 = ptVar8->mpNodeLeft;
          ptVar10 = ptVar6->mpNodeLeft;
          ptVar6->mColor = ptVar8->mColor;
          ptVar8->mColor = '\x01';
          ptVar5 = ptVar9;
          if (ptVar10 != (this_type *)0x0) {
LAB_00105403:
            ptVar10->mColor = '\x01';
            ptVar9 = ptVar5;
          }
          ptVar5 = ptVar6->mpNodeRight;
          ptVar8->mpNodeLeft = ptVar5;
          if (ptVar5 != (this_type *)0x0) {
            ptVar5->mpNodeParent = ptVar8;
          }
          ptVar5 = ptVar8->mpNodeParent;
          ptVar6->mpNodeParent = ptVar5;
          ptVar7 = ptVar6;
          if (ptVar8 != ptVar9) {
            (&ptVar5->mpNodeRight)[ptVar5->mpNodeRight != ptVar8] = ptVar6;
            ptVar7 = ptVar9;
          }
          ptVar6->mpNodeRight = ptVar8;
          goto LAB_001054f5;
        }
        ptVar10 = ptVar6->mpNodeLeft;
        if ((ptVar10 != (this_type *)0x0) && (ptVar10->mColor != '\x01')) {
LAB_0010538c:
          if (ptVar10->mColor == '\x01') goto LAB_00105393;
          ptVar6->mColor = ptVar8->mColor;
          ptVar8->mColor = '\x01';
          goto LAB_00105403;
        }
LAB_0010535d:
        ptVar6->mColor = '\0';
        bVar11 = ptVar8 != ptVar5;
        ptVar3 = ptVar8;
        ptVar8 = ptVar8->mpNodeParent;
      } while (bVar11);
    }
    ptVar3->mColor = '\x01';
  }
  return;
}

Assistant:

EASTL_API void RBTreeErase(rbtree_node_base* pNode, rbtree_node_base* pNodeAnchor)
    {
        rbtree_node_base*& pNodeRootRef      = pNodeAnchor->mpNodeParent;
        rbtree_node_base*& pNodeLeftmostRef  = pNodeAnchor->mpNodeLeft;
        rbtree_node_base*& pNodeRightmostRef = pNodeAnchor->mpNodeRight;
        rbtree_node_base*  pNodeSuccessor    = pNode;
        rbtree_node_base*  pNodeChild        = NULL;
        rbtree_node_base*  pNodeChildParent  = NULL;

        if(pNodeSuccessor->mpNodeLeft == NULL)         // pNode has at most one non-NULL child.
            pNodeChild = pNodeSuccessor->mpNodeRight;  // pNodeChild might be null.
        else if(pNodeSuccessor->mpNodeRight == NULL)   // pNode has exactly one non-NULL child.
            pNodeChild = pNodeSuccessor->mpNodeLeft;   // pNodeChild is not null.
        else 
        {
            // pNode has two non-null children. Set pNodeSuccessor to pNode's successor. pNodeChild might be NULL.
            pNodeSuccessor = pNodeSuccessor->mpNodeRight;

            while(pNodeSuccessor->mpNodeLeft)
                pNodeSuccessor = pNodeSuccessor->mpNodeLeft;

            pNodeChild = pNodeSuccessor->mpNodeRight;
        }

        // Here we remove pNode from the tree and fix up the node pointers appropriately around it.
        if(pNodeSuccessor == pNode) // If pNode was a leaf node (had both NULL children)...
        {
            pNodeChildParent = pNodeSuccessor->mpNodeParent;  // Assign pNodeReplacement's parent.

            if(pNodeChild) 
                pNodeChild->mpNodeParent = pNodeSuccessor->mpNodeParent;

            if(pNode == pNodeRootRef) // If the node being deleted is the root node...
                pNodeRootRef = pNodeChild; // Set the new root node to be the pNodeReplacement.
            else 
            {
                if(pNode == pNode->mpNodeParent->mpNodeLeft) // If pNode is a left node...
                    pNode->mpNodeParent->mpNodeLeft  = pNodeChild;  // Make pNode's replacement node be on the same side.
                else
                    pNode->mpNodeParent->mpNodeRight = pNodeChild;
                // Now pNode is disconnected from the bottom of the tree (recall that in this pathway pNode was determined to be a leaf).
            }

            if(pNode == pNodeLeftmostRef) // If pNode is the tree begin() node...
            {
                // Because pNode is the tree begin(), pNode->mpNodeLeft must be NULL.
                // Here we assign the new begin() (first node).
                if(pNode->mpNodeRight)
                    pNodeLeftmostRef = RBTreeGetMinChild(pNodeChild); 
                else
                    pNodeLeftmostRef = pNode->mpNodeParent; // This  makes (pNodeLeftmostRef == end()) if (pNode == root node)
            }

            if(pNode == pNodeRightmostRef) // If pNode is the tree last (rbegin()) node...
            {
                // Because pNode is the tree rbegin(), pNode->mpNodeRight must be NULL.
                // Here we assign the new rbegin() (last node)
                if(pNode->mpNodeLeft)
                    pNodeRightmostRef = RBTreeGetMaxChild(pNodeChild);
                else // pNodeChild == pNode->mpNodeLeft
                    pNodeRightmostRef = pNode->mpNodeParent; // makes pNodeRightmostRef == &mAnchor if pNode == pNodeRootRef
            }
        }
        else // else (pNodeSuccessor != pNode)
        {
            // Relink pNodeSuccessor in place of pNode. pNodeSuccessor is pNode's successor.
            // We specifically set pNodeSuccessor to be on the right child side of pNode, so fix up the left child side.
            pNode->mpNodeLeft->mpNodeParent = pNodeSuccessor; 
            pNodeSuccessor->mpNodeLeft = pNode->mpNodeLeft;

            if(pNodeSuccessor == pNode->mpNodeRight) // If pNode's successor was at the bottom of the tree... (yes that's effectively what this statement means)
                pNodeChildParent = pNodeSuccessor; // Assign pNodeReplacement's parent.
            else
            {
                pNodeChildParent = pNodeSuccessor->mpNodeParent;

                if(pNodeChild)
                    pNodeChild->mpNodeParent = pNodeChildParent;

                pNodeChildParent->mpNodeLeft = pNodeChild;

                pNodeSuccessor->mpNodeRight = pNode->mpNodeRight;
                pNode->mpNodeRight->mpNodeParent = pNodeSuccessor;
            }

            if(pNode == pNodeRootRef)
                pNodeRootRef = pNodeSuccessor;
            else if(pNode == pNode->mpNodeParent->mpNodeLeft)
                pNode->mpNodeParent->mpNodeLeft = pNodeSuccessor;
            else 
                pNode->mpNodeParent->mpNodeRight = pNodeSuccessor;

            // Now pNode is disconnected from the tree.

            pNodeSuccessor->mpNodeParent = pNode->mpNodeParent;
            eastl::swap(pNodeSuccessor->mColor, pNode->mColor);
        }

        // Here we do tree balancing as per the conventional red-black tree algorithm.
        if(pNode->mColor == kRBTreeColorBlack) 
        { 
            while((pNodeChild != pNodeRootRef) && ((pNodeChild == NULL) || (pNodeChild->mColor == kRBTreeColorBlack)))
            {
                if(pNodeChild == pNodeChildParent->mpNodeLeft) 
                {
                    rbtree_node_base* pNodeTemp = pNodeChildParent->mpNodeRight;

                    if(pNodeTemp->mColor == kRBTreeColorRed) 
                    {
                        pNodeTemp->mColor = kRBTreeColorBlack;
                        pNodeChildParent->mColor = kRBTreeColorRed;
                        pNodeRootRef = RBTreeRotateLeft(pNodeChildParent, pNodeRootRef);
                        pNodeTemp = pNodeChildParent->mpNodeRight;
                    }

                    if(((pNodeTemp->mpNodeLeft  == NULL) || (pNodeTemp->mpNodeLeft->mColor  == kRBTreeColorBlack)) &&
                        ((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack))) 
                    {
                        pNodeTemp->mColor = kRBTreeColorRed;
                        pNodeChild = pNodeChildParent;
                        pNodeChildParent = pNodeChildParent->mpNodeParent;
                    } 
                    else 
                    {
                        if((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack)) 
                        {
                            pNodeTemp->mpNodeLeft->mColor = kRBTreeColorBlack;
                            pNodeTemp->mColor = kRBTreeColorRed;
                            pNodeRootRef = RBTreeRotateRight(pNodeTemp, pNodeRootRef);
                            pNodeTemp = pNodeChildParent->mpNodeRight;
                        }

                        pNodeTemp->mColor = pNodeChildParent->mColor;
                        pNodeChildParent->mColor = kRBTreeColorBlack;

                        if(pNodeTemp->mpNodeRight) 
                            pNodeTemp->mpNodeRight->mColor = kRBTreeColorBlack;

                        pNodeRootRef = RBTreeRotateLeft(pNodeChildParent, pNodeRootRef);
                        break;
                    }
                } 
                else 
                {   
                    // The following is the same as above, with mpNodeRight <-> mpNodeLeft.
                    rbtree_node_base* pNodeTemp = pNodeChildParent->mpNodeLeft;

                    if(pNodeTemp->mColor == kRBTreeColorRed) 
                    {
                        pNodeTemp->mColor        = kRBTreeColorBlack;
                        pNodeChildParent->mColor = kRBTreeColorRed;

                        pNodeRootRef = RBTreeRotateRight(pNodeChildParent, pNodeRootRef);
                        pNodeTemp = pNodeChildParent->mpNodeLeft;
                    }

                    if(((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack)) &&
                        ((pNodeTemp->mpNodeLeft  == NULL) || (pNodeTemp->mpNodeLeft->mColor  == kRBTreeColorBlack))) 
                    {
                        pNodeTemp->mColor = kRBTreeColorRed;
                        pNodeChild       = pNodeChildParent;
                        pNodeChildParent = pNodeChildParent->mpNodeParent;
                    } 
                    else 
                    {
                        if((pNodeTemp->mpNodeLeft == NULL) || (pNodeTemp->mpNodeLeft->mColor == kRBTreeColorBlack)) 
                        {
                            pNodeTemp->mpNodeRight->mColor = kRBTreeColorBlack;
                            pNodeTemp->mColor              = kRBTreeColorRed;

                            pNodeRootRef = RBTreeRotateLeft(pNodeTemp, pNodeRootRef);
                            pNodeTemp = pNodeChildParent->mpNodeLeft;
                        }

                        pNodeTemp->mColor = pNodeChildParent->mColor;
                        pNodeChildParent->mColor = kRBTreeColorBlack;

                        if(pNodeTemp->mpNodeLeft) 
                            pNodeTemp->mpNodeLeft->mColor = kRBTreeColorBlack;

                        pNodeRootRef = RBTreeRotateRight(pNodeChildParent, pNodeRootRef);
                        break;
                    }
                }
            }

            if(pNodeChild)
                pNodeChild->mColor = kRBTreeColorBlack;
        }

    }